

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void acttab_action(acttab *p,int lookahead,int action)

{
  lookahead_action *plVar1;
  int action_local;
  int lookahead_local;
  acttab *p_local;
  
  if (p->nLookaheadAlloc <= p->nLookahead) {
    p->nLookaheadAlloc = p->nLookaheadAlloc + 0x19;
    plVar1 = (lookahead_action *)realloc(p->aLookahead,(long)p->nLookaheadAlloc << 3);
    p->aLookahead = plVar1;
    if (p->aLookahead == (lookahead_action *)0x0) {
      fprintf(_stderr,"malloc failed\n");
      exit(1);
    }
  }
  if (p->nLookahead == 0) {
    p->mxLookahead = lookahead;
    p->mnLookahead = lookahead;
    p->mnAction = action;
  }
  else {
    if (p->mxLookahead < lookahead) {
      p->mxLookahead = lookahead;
    }
    if (lookahead < p->mnLookahead) {
      p->mnLookahead = lookahead;
      p->mnAction = action;
    }
  }
  p->aLookahead[p->nLookahead].lookahead = lookahead;
  p->aLookahead[p->nLookahead].action = action;
  p->nLookahead = p->nLookahead + 1;
  return;
}

Assistant:

void acttab_action(acttab *p, int lookahead, int action){
  if( p->nLookahead>=p->nLookaheadAlloc ){
    p->nLookaheadAlloc += 25;
    p->aLookahead = (struct lookahead_action *) realloc( p->aLookahead,
                             sizeof(p->aLookahead[0])*p->nLookaheadAlloc );
    if( p->aLookahead==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
  }
  if( p->nLookahead==0 ){
    p->mxLookahead = lookahead;
    p->mnLookahead = lookahead;
    p->mnAction = action;
  }else{
    if( p->mxLookahead<lookahead ) p->mxLookahead = lookahead;
    if( p->mnLookahead>lookahead ){
      p->mnLookahead = lookahead;
      p->mnAction = action;
    }
  }
  p->aLookahead[p->nLookahead].lookahead = lookahead;
  p->aLookahead[p->nLookahead].action = action;
  p->nLookahead++;
}